

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O3

void AutoArgParse::printUnParsed
               (ostringstream *os,
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *flagInsertionOrder,FlagMap *flags)

{
  _Elt_pointer pbVar1;
  long *plVar2;
  bool bVar3;
  char cVar4;
  const_iterator cVar5;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagInsertionOrder_00;
  long lVar6;
  char *pcVar7;
  _Map_pointer ppbVar8;
  _Elt_pointer pbVar9;
  _Elt_pointer __k;
  
  __k = (flagInsertionOrder->
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar1 = (flagInsertionOrder->
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (__k != pbVar1) {
    pbVar9 = (flagInsertionOrder->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar8 = (flagInsertionOrder->
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    bVar3 = true;
    do {
      cVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&flags->_M_h,__k);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      cVar4 = (**(code **)(**(long **)((long)cVar5.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                             ._M_cur + 0x28) + 0x28))();
      plVar2 = *(long **)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                ._M_cur + 0x28);
      if (cVar4 == '\0') {
        if (((char)plVar2[1] == '\0') && (*(char *)((long)plVar2 + 9) == '\x01')) {
          if (bVar3) {
            lVar6 = 1;
            pcVar7 = " ";
          }
          else {
            lVar6 = 2;
            pcVar7 = ", ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar7,lVar6);
          if (*(int *)(*(long *)((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                       ._M_cur + 0x28) + 0xc) == 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"[",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)os,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          if (*(int *)(*(long *)((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                       ._M_cur + 0x28) + 0xc) == 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"]",1);
          }
          bVar3 = false;
        }
      }
      else {
        flagInsertionOrder_00 =
             (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(**(code **)(*plVar2 + 0x30))();
        printUnParsed(os,flagInsertionOrder_00,flags);
      }
      __k = __k + 1;
      if (__k == pbVar9) {
        __k = ppbVar8[1];
        ppbVar8 = ppbVar8 + 1;
        pbVar9 = __k + 0x10;
      }
    } while (__k != pbVar1);
  }
  return;
}

Assistant:

void printUnParsed(std::ostringstream& os,
                   const std::deque<std::string>& flagInsertionOrder,
                   const FlagMap& flags) {
    bool first = true;
    for (auto& flag : flagInsertionOrder) {
        auto& flagObj = flags.at(flag);
        if (flagObj->isExclusiveGroup()) {
            printUnParsed(os, flagObj->getFlagInsertionOrder(), flags);
            continue;
        }
        if (!flagObj->parsed() && flagObj->available()) {
            if (first) {
                os << " ";
                first = false;
            } else {
                os << ", ";
            }
            if (flagObj->policy == Policy::OPTIONAL) {
                os << "[";
            }
            os << flag;
            if (flagObj->policy == Policy::OPTIONAL) {
                os << "]";
            }
        }
    }
}